

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall QCss::Parser::parseNextDeclaration(Parser *this,Declaration *decl)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = testProperty(this);
  bVar2 = true;
  if (bVar1) {
    parseProperty(this,decl);
    bVar1 = next(this,COLON);
    if (bVar1) {
      skipSpace(this);
      bVar1 = parseNextExpr(this,&((decl->d).d.ptr)->values);
      if (bVar1) {
        bVar1 = testPrio(this);
        if (!bVar1) {
          return true;
        }
        parsePrio(this,decl);
        return true;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Parser::parseNextDeclaration(Declaration *decl)
{
    if (!testProperty())
        return true; // not an error!
    if (!parseProperty(decl)) return false;
    if (!next(COLON)) return false;
    skipSpace();
    if (!parseNextExpr(&decl->d->values)) return false;
    if (testPrio())
        if (!parsePrio(decl)) return false;
    return true;
}